

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O2

void __thiscall
btHashedOverlappingPairCache::processAllOverlappingPairs
          (btHashedOverlappingPairCache *this,btOverlapCallback *callback,btDispatcher *dispatcher)

{
  int iVar1;
  btBroadphasePair *pbVar2;
  int i;
  uint uVar3;
  
  uVar3 = 0;
  do {
    while( true ) {
      if ((this->m_overlappingPairArray).m_size <= (int)uVar3) {
        return;
      }
      pbVar2 = (this->m_overlappingPairArray).m_data + uVar3;
      iVar1 = (*callback->_vptr_btOverlapCallback[2])(callback,pbVar2);
      if ((char)iVar1 == '\0') break;
      (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
        _vptr_btOverlappingPairCallback[3])(this,pbVar2->m_pProxy0,pbVar2->m_pProxy1,dispatcher);
      gOverlappingPairs = gOverlappingPairs + -1;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void	btHashedOverlappingPairCache::processAllOverlappingPairs(btOverlapCallback* callback,btDispatcher* dispatcher)
{

	int i;

//	printf("m_overlappingPairArray.size()=%d\n",m_overlappingPairArray.size());
	for (i=0;i<m_overlappingPairArray.size();)
	{
	
		btBroadphasePair* pair = &m_overlappingPairArray[i];
		if (callback->processOverlap(*pair))
		{
			removeOverlappingPair(pair->m_pProxy0,pair->m_pProxy1,dispatcher);

			gOverlappingPairs--;
		} else
		{
			i++;
		}
	}
}